

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O1

int ConnectSeanet(SEANET *pSeanet,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char line [256];
  uchar databuf [22];
  char local_1e8;
  char local_1e7;
  int *local_e8;
  BOOL *local_e0;
  int *local_d8;
  int *local_d0;
  int *local_c8;
  int *local_c0;
  int *local_b8;
  int *local_b0;
  double *local_a8;
  int *local_a0;
  int *local_98;
  int *local_90;
  int *local_88;
  int *local_80;
  int *local_78;
  double *local_70;
  double *local_68;
  int *local_60;
  int *local_58;
  int local_4c;
  uchar local_48 [20];
  byte bStack_34;
  undefined1 uStack_33;
  
  memset(pSeanet->szCfgFilePath,0,0x100);
  sprintf(pSeanet->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_1e8,0,0x100);
    memset(pSeanet->szDevPath + 5,0,0xfb);
    builtin_strncpy(pSeanet->szDevPath,"COM1",5);
    pSeanet->BaudRate = 0x1c200;
    pSeanet->timeout = 0x5dc;
    pSeanet->threadperiod = 100;
    pSeanet->bSaveRawData = 1;
    pSeanet->RangeScale = 0x1e;
    pSeanet->Gain = 0x32;
    pSeanet->Sensitivity = 3;
    pSeanet->Contrast = 0x19;
    pSeanet->ScanDirection = 0;
    pSeanet->ScanWidth = 0x168;
    pSeanet->StepAngleSize = 3.6;
    pSeanet->NBins = 200;
    pSeanet->adc8on = 1;
    pSeanet->scanright = 0;
    pSeanet->invert = 0;
    pSeanet->stareLLim = 0;
    pSeanet->VelocityOfSound = 0x5dc;
    pSeanet->alpha_max_err = 0.01;
    pSeanet->d_max_err = 0.1;
    pSeanet->HorizontalBeam = 3;
    pSeanet->VerticalBeam = 0x28;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      local_e8 = &pSeanet->threadperiod;
      local_e0 = &pSeanet->bSaveRawData;
      local_d8 = &pSeanet->RangeScale;
      local_d0 = &pSeanet->Gain;
      local_c8 = &pSeanet->Sensitivity;
      local_c0 = &pSeanet->Contrast;
      local_b8 = &pSeanet->ScanDirection;
      local_b0 = &pSeanet->ScanWidth;
      local_a8 = &pSeanet->StepAngleSize;
      local_a0 = &pSeanet->NBins;
      local_98 = &pSeanet->adc8on;
      local_90 = &pSeanet->scanright;
      local_88 = &pSeanet->invert;
      local_80 = &pSeanet->stareLLim;
      local_78 = &pSeanet->VelocityOfSound;
      local_70 = &pSeanet->alpha_max_err;
      local_68 = &pSeanet->d_max_err;
      local_60 = &pSeanet->HorizontalBeam;
      local_58 = &pSeanet->VerticalBeam;
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a1289;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a1289:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%255s",pSeanet->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a1308;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a1308:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",&pSeanet->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a1387;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a1387:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",&pSeanet->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a1406;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a1406:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_e8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a148a;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a148a:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_e0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a150e;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a150e:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_d8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a1592;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a1592:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_d0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a1616;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a1616:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_c8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a169a;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a169a:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_c0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a171e;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a171e:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_b8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a17a2;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a17a2:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_b0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a1826;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a1826:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%lf",local_a8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a18aa;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a18aa:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_a0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a192e;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a192e:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_98);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a19b2;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a19b2:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_90);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a1a36;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a1a36:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_88);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a1aba;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a1aba:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_80);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a1b3e;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a1b3e:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_78);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a1bc2;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a1bc2:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%lf",local_70);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a1c46;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a1c46:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%lf",local_68);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a1cca;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a1cca:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_60);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1e8,0x100,__stream), local_1e8 != '#' && (local_1e8 != '%')))
        {
          if ((local_1e8 != '/') || ((pcVar2 == (char *)0x0 || (local_1e7 != '/'))))
          goto LAB_001a1d4e;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001a1d4e:
      if (pcVar2 == (char *)0x0 || local_1e8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1e8,"%d",local_58);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_001a1db7;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_001a1db7:
  if (pSeanet->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pSeanet->threadperiod = 100;
  }
  if (0x167 < (uint)pSeanet->ScanDirection) {
    puts("Invalid parameter : ScanDirection.");
    pSeanet->ScanDirection = 0;
  }
  if (pSeanet->ScanWidth - 0x169U < 0xfffffe99) {
    puts("Invalid parameter : ScanWidth.");
    pSeanet->ScanWidth = 0x168;
  }
  if (pSeanet->VelocityOfSound < 1) {
    puts("Invalid parameter : VelocityOfSound.");
    pSeanet->VelocityOfSound = 0x5dc;
  }
  if (pSeanet->HorizontalBeam - 0x169U < 0xfffffe98) {
    puts("Invalid parameter : HorizontalBeam.");
    pSeanet->HorizontalBeam = 3;
  }
  if (pSeanet->VerticalBeam - 0x169U < 0xfffffe98) {
    puts("Invalid parameter : VerticalBeam.");
    pSeanet->VerticalBeam = 0x28;
  }
  iVar1 = OpenRS232Port(&pSeanet->RS232Port,pSeanet->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a Seanet.");
    return 1;
  }
  iVar1 = (pSeanet->RS232Port).DevType;
  if (3 < iVar1 - 1U) {
    if ((iVar1 != 0) ||
       (iVar1 = SetOptionsComputerRS232Port
                          ((pSeanet->RS232Port).hDev,pSeanet->BaudRate,'\0',0,'\b','\0',
                           pSeanet->timeout), iVar1 != 0)) goto LAB_001a1f84;
    tcflush(*(int *)&(pSeanet->RS232Port).hDev,2);
  }
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  bStack_34 = 0;
  uStack_33 = 0;
  local_4c = 0;
  iVar1 = GetLatestMsgSeanet(pSeanet,4,local_48,0x16,&local_4c);
  if (iVar1 == 0) {
    pSeanet->HeadInf = (uint)bStack_34;
    iVar1 = RebootSeanet(pSeanet);
    if ((((iVar1 == 0) && (iVar1 = GetVersionSeanet(pSeanet), iVar1 == 0)) &&
        (iVar1 = GetBBUserSeanet(pSeanet), iVar1 == 0)) &&
       (iVar1 = SetHeadCommandSeanet(pSeanet), iVar1 == 0)) {
      puts("Seanet connected.");
      return 0;
    }
  }
  else {
    puts("A Seanet is not responding correctly. ");
  }
LAB_001a1f84:
  puts("Unable to connect to a Seanet.");
  CloseRS232Port(&pSeanet->RS232Port);
  return 1;
}

Assistant:

inline int ConnectSeanet(SEANET* pSeanet, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pSeanet->szCfgFilePath, 0, sizeof(pSeanet->szCfgFilePath));
	sprintf(pSeanet->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pSeanet->szDevPath, 0, sizeof(pSeanet->szDevPath));
		sprintf(pSeanet->szDevPath, "COM1");
		pSeanet->BaudRate = 115200;
		pSeanet->timeout = 1500;
		pSeanet->threadperiod = 100;
		pSeanet->bSaveRawData = 1;
		pSeanet->RangeScale = 30;
		pSeanet->Gain = 50;
		pSeanet->Sensitivity = 3;
		pSeanet->Contrast = 25;
		pSeanet->ScanDirection = 0;
		pSeanet->ScanWidth = 360;
		pSeanet->StepAngleSize = 3.6;
		pSeanet->NBins = 200;
		pSeanet->adc8on = 1;
		pSeanet->scanright = 0;
		pSeanet->invert = 0;
		pSeanet->stareLLim = 0;
		pSeanet->VelocityOfSound = 1500;
		pSeanet->alpha_max_err = 0.01;
		pSeanet->d_max_err = 0.1;
		pSeanet->HorizontalBeam = 3;
		pSeanet->VerticalBeam = 40;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pSeanet->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->RangeScale) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->Gain) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->Sensitivity) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->Contrast) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->ScanDirection) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->ScanWidth) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSeanet->StepAngleSize) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->NBins) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->adc8on) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->scanright) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->invert) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->stareLLim) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->VelocityOfSound) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSeanet->alpha_max_err) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSeanet->d_max_err) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->HorizontalBeam) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->VerticalBeam) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pSeanet->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pSeanet->threadperiod = 100;
	}
	if ((pSeanet->ScanDirection < 0)||(pSeanet->ScanDirection > 359))
	{
		printf("Invalid parameter : ScanDirection.\n");
		pSeanet->ScanDirection = 0;
	}
	if ((pSeanet->ScanWidth < 2)||(pSeanet->ScanWidth > 360))
	{
		printf("Invalid parameter : ScanWidth.\n");
		pSeanet->ScanWidth = 360;
	}
	if (pSeanet->VelocityOfSound <= 0)
	{
		printf("Invalid parameter : VelocityOfSound.\n");
		pSeanet->VelocityOfSound = 1500;
	}
	if ((pSeanet->HorizontalBeam <= 0)||(pSeanet->HorizontalBeam > 360))
	{
		printf("Invalid parameter : HorizontalBeam.\n");
		pSeanet->HorizontalBeam = 3;
	}
	if ((pSeanet->VerticalBeam <= 0)||(pSeanet->VerticalBeam > 360))
	{
		printf("Invalid parameter : VerticalBeam.\n");
		pSeanet->VerticalBeam = 40;
	}

	// Used to save raw data, should be handled specifically...
	//pSeanet->pfSaveFile = NULL;

	if (OpenRS232Port(&pSeanet->RS232Port, pSeanet->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pSeanet->RS232Port, pSeanet->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pSeanet->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (GetLatestAliveMsgSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (RebootSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (GetVersionSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (GetBBUserSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (SetHeadCommandSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	printf("Seanet connected.\n");

	return EXIT_SUCCESS;
}